

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::doAddCol
          (SPxLPBase<double> *this,double *objValue,double *lowerValue,SVectorBase<double> *colVec,
          double *upperValue,bool scale)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  Item *pIVar6;
  Nonzero<double> *pNVar7;
  bool bVar8;
  double *pdVar9;
  int iVar10;
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int idx;
  double val;
  int local_b4;
  int local_9c;
  DataKey local_98;
  _func_int **local_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  LPRowBase<double> local_68;
  
  iVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar4 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_98 = (DataKey)((ulong)local_98 & 0xffffffff00000000);
  local_68.left = -NAN;
  local_9c = iVar3;
  LPColSetBase<double>::add
            (&this->super_LPColSetBase<double>,(DataKey *)&local_68,objValue,lowerValue,colVec,
             upperValue,&local_98.info);
  if (this->thesense != MAXIMIZE) {
    pdVar5 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5[iVar3] = -pdVar5[iVar3];
  }
  if (scale) {
    local_b4 = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,colVec,&(this->super_LPRowSetBase<double>).scaleExp);
    dVar11 = (this->super_LPColSetBase<double>).up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar3];
    ::soplex::infinity::__tls_init();
    pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_88 = *pdVar9;
    uStack_80 = 0;
    if (dVar11 < local_88) {
      dVar11 = ldexp((this->super_LPColSetBase<double>).up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3],-local_b4);
      (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar3] = dVar11;
    }
    dVar11 = (this->super_LPColSetBase<double>).low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar3];
    ::soplex::infinity::__tls_init();
    if (-local_88 < dVar11) {
      dVar11 = ldexp((this->super_LPColSetBase<double>).low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3],-local_b4);
      (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar3] = dVar11;
    }
    dVar11 = ldexp((this->super_LPColSetBase<double>).object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3],local_b4);
    (this->super_LPColSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar3] = dVar11;
    (this->super_LPColSetBase<double>).scaleExp.data[iVar3] = local_b4;
  }
  else {
    local_b4 = 0;
  }
  pIVar6 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx;
  dVar11 = (double)(long)pIVar6[iVar3].data.super_SVectorBase<double>.memused;
  if (0 < (long)dVar11) {
    pIVar6 = pIVar6 + iVar3;
    local_90 = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    do {
      dVar1 = (double)((long)dVar11 + -1);
      pNVar7 = (pIVar6->data).super_SVectorBase<double>.m_elem;
      iVar3 = pNVar7[(long)dVar1].idx;
      dVar2 = pNVar7[(long)dVar1].val;
      uVar12 = SUB84(dVar2,0);
      uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
      local_88 = dVar1;
      if (scale) {
        dVar2 = ldexp(dVar2,(this->super_LPRowSetBase<double>).scaleExp.data[iVar3] + local_b4);
        uVar12 = SUB84(dVar2,0);
        uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
        (pIVar6->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = dVar2;
      }
      local_70 = (double)CONCAT44(uVar13,uVar12);
      if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar3) {
        LPRowBase<double>::LPRowBase(&local_68,0);
        iVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar10 <= iVar3) {
          iVar10 = (iVar3 - iVar10) + 1;
          do {
            local_98.info = 0;
            local_98.idx = -1;
            LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_98,&local_68);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        local_68.vec._vptr_DSVectorBase = local_90;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
        }
      }
      SVSetBase<double>::add2
                ((SVSetBase<double> *)this,
                 (SVectorBase<double> *)
                 ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx),1
                 ,&local_9c,&local_70);
      bVar8 = 1 < (long)dVar11;
      dVar11 = local_88;
    } while (bVar8);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar4));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }